

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_pickups.cpp
# Opt level: O3

bool __thiscall AInventory::CallTryPickup(AInventory *this,AActor *toucher,AActor **toucher_return)

{
  AInventory *pAVar1;
  AInventory *pAVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  long lVar6;
  AInventory *titem;
  AInventory *this_00;
  AActor *local_28;
  
  if (((toucher->flags).Value & 0x10000000) == 0) {
    this_00 = (this->super_AActor).Inventory.field_0.p;
    local_28 = toucher;
    bVar3 = CanPickup(this,toucher);
    lVar6 = 0x208;
    if ((bVar3) || (lVar6 = 0x210, (this->ItemFlags & 0x80000) == 0)) {
      cVar4 = (**(code **)((long)(this->super_AActor).super_DThinker.super_DObject._vptr_DObject +
                          lVar6))(this,&local_28);
      if (toucher_return != (AActor **)0x0) {
        *toucher_return = local_28;
      }
      if (cVar4 == '\0') {
        if ((this->ItemFlags & 0x400) == 0) {
          return false;
        }
        iVar5 = (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x27])(this);
        if ((char)iVar5 != '\0') {
          return false;
        }
        (*(this->super_AActor).super_DThinker.super_DObject._vptr_DObject[0x36])(this);
      }
      GiveQuest(this,local_28);
      if (this_00 == (AInventory *)0x0 || (this->ItemFlags & 0x1000000) == 0) {
        return true;
      }
      do {
        if (((this_00->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) != 0) {
          return true;
        }
        pAVar1 = (this_00->super_AActor).Inventory.field_0.p;
        pAVar2 = (AInventory *)(this_00->Owner).field_0.p;
        if (pAVar2 != (AInventory *)0x0) {
          if (((pAVar2->super_AActor).super_DThinker.super_DObject.ObjectFlags & 0x20) == 0) {
            if ((pAVar2 == this) && (bVar3 = CallTryPickup(this_00,local_28,(AActor **)0x0), !bVar3)
               ) {
              (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])(this_00);
            }
          }
          else {
            (this_00->Owner).field_0.p = (AActor *)0x0;
          }
        }
        this_00 = pAVar1;
      } while (pAVar1 != (AInventory *)0x0);
      return true;
    }
  }
  return false;
}

Assistant:

bool AInventory::CallTryPickup (AActor *toucher, AActor **toucher_return)
{
	TObjPtr<AInventory> Invstack = Inventory; // A pointer of the inventories item stack.

	// unmorphed versions of a currently morphed actor cannot pick up anything. 
	if (toucher->flags & MF_UNMORPHED) return false;

	bool res;
	if (CanPickup(toucher))
		res = TryPickup(toucher);
	else if (!(ItemFlags & IF_RESTRICTABSOLUTELY))
		res = TryPickupRestricted(toucher);	// let an item decide for itself how it will handle this
	else
		return false;

	// Morph items can change the toucher so we need an option to return this info.
	if (toucher_return != NULL) *toucher_return = toucher;

	if (!res && (ItemFlags & IF_ALWAYSPICKUP) && !ShouldStay())
	{
		res = true;
		GoAwayAndDie();
	}

	if (res)
	{
		GiveQuest(toucher);

		// Transfer all inventory accross that the old object had, if requested.
		if ((ItemFlags & IF_TRANSFER))
		{
			while (Invstack)
			{
				AInventory* titem = Invstack;
				Invstack = titem->Inventory;
				if (titem->Owner == this)
				{
					if (!titem->CallTryPickup(toucher)) // The object no longer can exist
					{
						titem->Destroy();
					}
				}
			}
		}
	}
	return res;
}